

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st2013.hpp
# Opt level: O2

void bcl::st2013::
     generate_transition_matrix_resize<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
               (vector<double,_std::allocator<double>_> *weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *tm)

{
  long lVar1;
  size_type sVar2;
  size_type __new_size;
  bool bVar3;
  
  __new_size = (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(tm,__new_size);
  lVar1 = 0;
  sVar2 = __new_size;
  while (bVar3 = sVar2 != 0, sVar2 = sVar2 - 1, bVar3) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((tm->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar1),__new_size);
    lVar1 = lVar1 + 0x18;
  }
  generate_transition_matrix<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
            (weights,tm);
  return;
}

Assistant:

static void generate_transition_matrix_resize(VEC const& weights, MAT& tm) {
    std::size_t n = weights.size();
    tm.resize(n);
    for (std::size_t i = 0; i < n; ++i) tm[i].resize(n);
    generate_transition_matrix(weights, tm);
  }